

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::execute
          (ComputeShaderExecutor *this,int numValues,void **inputs,void **outputs)

{
  pointer pVVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  deUint32 dVar5;
  int iVar6;
  int curOffset;
  int iVar7;
  deUint32 local_48;
  long lVar4;
  
  iVar2 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pVVar1 = (this->super_BufferIoExecutor).m_inputLayout.
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = 0;
  dVar5 = 0;
  if (pVVar1 != (this->super_BufferIoExecutor).m_inputLayout.
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar5 = pVVar1->stride;
  }
  pVVar1 = (this->super_BufferIoExecutor).m_outputLayout.
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->super_BufferIoExecutor).m_outputLayout.
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_48 = pVVar1->stride;
  }
  iVar2 = (this->m_maxWorkSize).m_data[0];
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  for (iVar7 = 0; iVar6 = numValues - iVar7, iVar6 != 0 && iVar7 <= numValues; iVar7 = iVar7 + iVar6
      ) {
    if (iVar2 < iVar6) {
      iVar6 = iVar2;
    }
    if (dVar5 != 0) {
      (**(code **)(lVar4 + 0x50))
                (0x90d2,0,(this->super_BufferIoExecutor).m_inputBuffer.super_ObjectWrapper.m_object,
                 iVar7 * dVar5,iVar6 * dVar5);
    }
    (**(code **)(lVar4 + 0x50))
              (0x90d2,1,(this->super_BufferIoExecutor).m_outputBuffer.super_ObjectWrapper.m_object,
               iVar7 * local_48,iVar6 * local_48);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBufferRange(GL_SHADER_STORAGE_BUFFER)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x4cc);
    (**(code **)(lVar4 + 0x528))(iVar6,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glDispatchCompute()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                    ,0x4cf);
  }
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void ComputeShaderExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl						= m_renderCtx.getFunctions();
	const int				maxValuesPerInvocation	= m_maxWorkSize[0];
	const deUint32			inputStride				= getInputStride();
	const deUint32			outputStride			= getOutputStride();

	initBuffers(numValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	// Perform compute invocations
	{
		int curOffset = 0;
		while (curOffset < numValues)
		{
			const int numToExec = de::min(maxValuesPerInvocation, numValues-curOffset);

			if (inputStride > 0)
				gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer(), curOffset*inputStride, numToExec*inputStride);

			gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer(), curOffset*outputStride, numToExec*outputStride);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_SHADER_STORAGE_BUFFER)");

			gl.dispatchCompute(numToExec, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

			curOffset += numToExec;
		}
	}

	// Read back data
	readOutputBuffer(outputs, numValues);
}